

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaH_get(Table *t,TValue *key)

{
  int iVar1;
  TValue *pTVar2;
  double dVar3;
  Node *local_38;
  Node *n_1;
  lua_Number n;
  int k;
  TValue *key_local;
  Table *t_local;
  
  iVar1 = key->tt;
  if (iVar1 != 0) {
    if (iVar1 == 3) {
      dVar3 = (double)(int)(key->value).n;
      if ((dVar3 == (key->value).n) && (!NAN(dVar3) && !NAN((key->value).n))) {
        pTVar2 = luaH_getnum(t,(int)(key->value).n);
        return pTVar2;
      }
    }
    else if (iVar1 == 4) {
      pTVar2 = luaH_getstr(t,&((key->value).gc)->ts);
      return pTVar2;
    }
    local_38 = mainposition(t,key);
    do {
      iVar1 = luaO_rawequalObj(&(local_38->i_key).tvk,key);
      if (iVar1 != 0) {
        return &local_38->i_val;
      }
      local_38 = (local_38->i_key).nk.next;
    } while (local_38 != (Node *)0x0);
  }
  t_local = (Table *)&luaO_nilobject_;
  return (TValue *)t_local;
}

Assistant:

static const TValue*luaH_get(Table*t,const TValue*key){
switch(ttype(key)){
case 0:return(&luaO_nilobject_);
case 4:return luaH_getstr(t,rawtsvalue(key));
case 3:{
int k;
lua_Number n=nvalue(key);
lua_number2int(k,n);
if(luai_numeq(cast_num(k),nvalue(key)))
return luaH_getnum(t,k);
}
default:{
Node*n=mainposition(t,key);
do{
if(luaO_rawequalObj(key2tval(n),key))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}
}